

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::AddP70time(Node *this,string *name,int64_t value)

{
  Node n;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  Node local_88;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"P",&local_c9);
  Node(&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_c8,(string *)name);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,long>
            (&local_88,&local_c8,"KTime","Time","",value);
  std::__cxx11::string::~string((string *)&local_c8);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_88);
  ~Node(&local_88);
  return;
}

Assistant:

void FBX::Node::AddP70time(
    const std::string& name, int64_t value
) {
    FBX::Node n("P");
    n.AddProperties(name, "KTime", "Time", "", value);
    AddChild(n);
}